

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnbitfield * copybitfield(rnnbitfield *bf,char *file)

{
  rnnbitfield *prVar1;
  char *pcVar2;
  rnnbitfield *res;
  char *file_local;
  rnnbitfield *bf_local;
  
  prVar1 = (rnnbitfield *)calloc(0xe8,1);
  pcVar2 = strdup(bf->name);
  prVar1->name = pcVar2;
  prVar1->low = bf->low;
  prVar1->high = bf->high;
  copyvarinfo(&prVar1->varinfo,&bf->varinfo);
  prVar1->file = file;
  copytypeinfo(&prVar1->typeinfo,&bf->typeinfo,file);
  return prVar1;
}

Assistant:

static struct rnnbitfield *copybitfield (struct rnnbitfield *bf, char *file) {
	struct rnnbitfield *res = calloc (sizeof *res, 1);
	res->name = strdup(bf->name);
	res->low = bf->low;
	res->high = bf->high;
	copyvarinfo(&res->varinfo, &bf->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &bf->typeinfo, file);
	return res;
}